

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aprog.c
# Opt level: O0

void aprog_set(AREA_DATA_conflict *area,char *progtype,char *name)

{
  bool bVar1;
  char *pcVar2;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  __type_conflict2 _Var3;
  char **unaff_retaddr;
  CLogger *in_stack_00000008;
  string_view in_stack_00000010;
  int i;
  char *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  
  iVar4 = 0;
  while ((aprog_table[iVar4].name != (char *)0x0 &&
         (bVar1 = str_cmp(aprog_table[iVar4].name,in_RDX), bVar1))) {
    iVar4 = iVar4 + 1;
  }
  if (aprog_table[iVar4].name == (char *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(iVar4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
    CLogger::Warn<char*&>(in_stack_00000008,in_stack_00000010,unaff_retaddr);
  }
  else {
    bVar1 = str_cmp(in_RSI,"pulse_prog");
    if (bVar1) {
      bVar1 = str_cmp(in_RSI,"reset_prog");
      if (bVar1) {
        bVar1 = str_cmp(in_RSI,"sun_prog");
        if (bVar1) {
          bVar1 = str_cmp(in_RSI,"tick_prog");
          if (bVar1) {
            bVar1 = str_cmp(in_RSI,"aggress_prog");
            if (bVar1) {
              bVar1 = str_cmp(in_RSI,"myell_prog");
              if (!bVar1) {
                *(void **)(*(long *)(in_RDI + 0x20) + 0x28) = aprog_table[iVar4].function;
                free_pstring(in_stack_ffffffffffffffd0);
                pcVar2 = palloc_string(in_RDI);
                *(char **)(*(long *)(in_RDI + 0x20) + 0x58) = pcVar2;
                _Var3 = std::pow<int,int>(0,0x6c0965);
                *(ulong *)(in_RDI + 0x28) = (long)_Var3 | *(ulong *)(in_RDI + 0x28);
              }
            }
            else {
              *(void **)(*(long *)(in_RDI + 0x20) + 0x20) = aprog_table[iVar4].function;
              free_pstring(in_stack_ffffffffffffffd0);
              pcVar2 = palloc_string(in_RDI);
              *(char **)(*(long *)(in_RDI + 0x20) + 0x50) = pcVar2;
              _Var3 = std::pow<int,int>(0,0x6c08da);
              *(ulong *)(in_RDI + 0x28) = (long)_Var3 | *(ulong *)(in_RDI + 0x28);
            }
          }
          else {
            *(void **)(*(long *)(in_RDI + 0x20) + 0x18) = aprog_table[iVar4].function;
            free_pstring(in_stack_ffffffffffffffd0);
            pcVar2 = palloc_string(in_RDI);
            *(char **)(*(long *)(in_RDI + 0x20) + 0x48) = pcVar2;
            _Var3 = std::pow<int,int>(0,0x6c084f);
            *(ulong *)(in_RDI + 0x28) = (long)_Var3 | *(ulong *)(in_RDI + 0x28);
          }
        }
        else {
          *(void **)(*(long *)(in_RDI + 0x20) + 0x10) = aprog_table[iVar4].function;
          free_pstring(in_stack_ffffffffffffffd0);
          pcVar2 = palloc_string(in_RDI);
          *(char **)(*(long *)(in_RDI + 0x20) + 0x40) = pcVar2;
          _Var3 = std::pow<int,int>(0,0x6c07c4);
          *(ulong *)(in_RDI + 0x28) = (long)_Var3 | *(ulong *)(in_RDI + 0x28);
        }
      }
      else {
        *(void **)(*(long *)(in_RDI + 0x20) + 8) = aprog_table[iVar4].function;
        free_pstring(in_stack_ffffffffffffffd0);
        pcVar2 = palloc_string(in_RDI);
        *(char **)(*(long *)(in_RDI + 0x20) + 0x38) = pcVar2;
        _Var3 = std::pow<int,int>(0,0x6c073c);
        *(ulong *)(in_RDI + 0x28) = (long)_Var3 | *(ulong *)(in_RDI + 0x28);
      }
    }
    else {
      **(undefined8 **)(in_RDI + 0x20) = aprog_table[iVar4].function;
      free_pstring(in_stack_ffffffffffffffd0);
      pcVar2 = palloc_string(in_RDI);
      *(char **)(*(long *)(in_RDI + 0x20) + 0x30) = pcVar2;
      _Var3 = std::pow<int,int>(0,0x6c06b1);
      *(ulong *)(in_RDI + 0x28) = (long)_Var3 | *(ulong *)(in_RDI + 0x28);
    }
  }
  return;
}

Assistant:

void aprog_set(AREA_DATA *area, const char *progtype, const char *name)
{
	int i;

	for (i = 0; aprog_table[i].name; i++)
	{
		if (!str_cmp(aprog_table[i].name, name))
			break;
	}

	if (!aprog_table[i].name)
	{
		RS.Logger.Warn("Load_improgs: 'A': Function not found for area {}.", area->name);
		return;
	}

	// IF YOU ADD A NEW TYPE ALSO PUT IT IN DB.C DO_ADUMP!

	if (!str_cmp(progtype, "pulse_prog"))
	{
		area->aprogs->pulse_prog = (APROG_FUN_PULSE *)aprog_table[i].function;
		free_pstring(area->aprogs->pulse_name);
		area->aprogs->pulse_name = palloc_string(name);
		SET_BIT(area->progtypes, APROG_PULSE);
		return;
	}

	if (!str_cmp(progtype, "reset_prog"))
	{
		area->aprogs->reset_prog = (APROG_FUN_RESET *)aprog_table[i].function;
		free_pstring(area->aprogs->reset_name);
		area->aprogs->reset_name = palloc_string(name);
		SET_BIT(area->progtypes, APROG_RESET);
		return;
	}

	if (!str_cmp(progtype, "sun_prog"))
	{
		area->aprogs->sun_prog = (APROG_FUN_SUN *)aprog_table[i].function;
		free_pstring(area->aprogs->sun_name);
		area->aprogs->sun_name = palloc_string(name);
		SET_BIT(area->progtypes, APROG_SUN);
		return;
	}

	if (!str_cmp(progtype, "tick_prog"))
	{
		area->aprogs->tick_prog = (APROG_FUN_TICK *)aprog_table[i].function;

		free_pstring(area->aprogs->tick_name);
		area->aprogs->tick_name = palloc_string(name);
		SET_BIT(area->progtypes, APROG_TICK);
		return;
	}

	if (!str_cmp(progtype, "aggress_prog"))
	{
		area->aprogs->aggress_prog = (APROG_FUN_AGGRESS *)aprog_table[i].function;
		free_pstring(area->aprogs->aggress_name);
		area->aprogs->aggress_name = palloc_string(name);
		SET_BIT(area->progtypes, APROG_AGGRESS);
		return;
	}

	if (!str_cmp(progtype, "myell_prog"))
	{
		area->aprogs->myell_prog = (APROG_FUN_MYELL *)aprog_table[i].function;
		free_pstring(area->aprogs->myell_name);
		area->aprogs->myell_name = palloc_string(name);
		SET_BIT(area->progtypes, APROG_MYELL);
		return;
	}
}